

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O2

void mod2dense_copy(mod2dense *m,mod2dense *r)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  if ((m->n_rows <= r->n_rows) && (iVar2 = m->n_cols, iVar2 <= r->n_cols)) {
    for (lVar1 = 0; lVar1 < iVar2; lVar1 = lVar1 + 1) {
      for (lVar3 = 0; lVar3 < m->n_words; lVar3 = lVar3 + 1) {
        r->col[lVar1][lVar3] = m->col[lVar1][lVar3];
      }
      for (; lVar3 < r->n_words; lVar3 = lVar3 + 1) {
        r->col[lVar1][lVar3] = 0;
      }
      iVar2 = m->n_cols;
    }
    for (; lVar1 < r->n_cols; lVar1 = lVar1 + 1) {
      for (lVar3 = 0; lVar3 < r->n_words; lVar3 = lVar3 + 1) {
        r->col[lVar1][lVar3] = 0;
      }
    }
    return;
  }
  fwrite("mod2dense_copy: Destination matrix is too small\n",0x30,1,_stderr);
  exit(1);
}

Assistant:

void mod2dense_copy
( mod2dense *m,		/* Matrix to copy */
  mod2dense *r		/* Place to store copy of matrix */
)
{ 
  int k, j;

  if (mod2dense_rows(m)>mod2dense_rows(r) 
   || mod2dense_cols(m)>mod2dense_cols(r))
  { fprintf(stderr,"mod2dense_copy: Destination matrix is too small\n");
    exit(1);
  }

  for (j = 0; j<mod2dense_cols(m); j++)
  { for (k = 0; k<m->n_words; k++)
    { r->col[j][k] = m->col[j][k];
    }
    for ( ; k<r->n_words; k++)
    { r->col[j][k] = 0;
    }
  }

  for ( ; j<mod2dense_cols(r); j++)
  { for (k = 0; k<r->n_words; k++)
    { r->col[j][k] = 0;
    }
  }
}